

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cb_explore_adf.cc
# Opt level: O3

void CB_EXPLORE_ADF::predict_or_learn_bag<true>
               (cb_explore_adf *data,multi_learner *base,multi_ex *examples)

{
  pointer *ppfVar1;
  uint uVar2;
  pointer ppeVar3;
  pointer pfVar4;
  iterator __position;
  float *pfVar5;
  action_score *paVar6;
  float *pfVar7;
  ulong uVar8;
  size_t i;
  long lVar9;
  ulong uVar10;
  uint32_t uVar11;
  ulong uVar12;
  uint uVar13;
  int iVar14;
  float fVar15;
  v_array<ACTION_SCORE::action_score> *__range3;
  action_score local_78;
  action_score *local_70;
  polyprediction *local_68;
  example *local_60;
  example *local_58;
  ulong local_50;
  vector<float,_std::allocator<float>_> *local_48;
  pointer_____offset_0x10___ *local_40;
  action_score *local_38;
  
  ppeVar3 = (examples->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
            super__Vector_impl_data._M_start;
  local_60 = *ppeVar3;
  local_68 = &local_60->pred;
  uVar12 = (long)(examples->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
                 super__Vector_impl_data._M_finish - (long)ppeVar3 >> 3;
  if ((int)uVar12 == 0) {
    v_array<ACTION_SCORE::action_score>::clear
              ((v_array<ACTION_SCORE::action_score> *)&local_68->scalars);
    return;
  }
  pfVar4 = (data->scores).super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((data->scores).super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_finish != pfVar4) {
    (data->scores).super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
    ._M_finish = pfVar4;
  }
  uVar8 = uVar12 & 0xffffffff;
  do {
    local_78 = (action_score)((ulong)local_78 & 0xffffffff00000000);
    __position._M_current =
         (data->scores).super__Vector_base<float,_std::allocator<float>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (data->scores).super__Vector_base<float,_std::allocator<float>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<float,_std::allocator<float>_>::_M_realloc_insert<float>
                (&data->scores,__position,(float *)&local_78);
    }
    else {
      *__position._M_current = 0.0;
      ppfVar1 = &(data->scores).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_finish;
      *ppfVar1 = *ppfVar1 + 1;
    }
    uVar13 = (int)uVar8 - 1;
    uVar8 = (ulong)uVar13;
  } while (uVar13 != 0);
  local_48 = &data->top_actions;
  local_50 = uVar12 & 0xffffffff;
  local_78 = (action_score)((ulong)local_78 & 0xffffffff00000000);
  std::vector<float,_std::allocator<float>_>::_M_fill_assign
            (local_48,local_50,(value_type_conflict3 *)&local_78);
  local_58 = test_adf_sequence(examples);
  if (data->bag_size != 0) {
    uVar12 = 0;
    do {
      uVar11 = (uint32_t)uVar12;
      if ((uVar11 == 0) && (uVar13 = 1, data->greedify != false)) {
LAB_0020d4b2:
        if (local_58 == (example *)0x0) goto LAB_0020d6b6;
        LEARNER::multiline_learn_or_predict<true>(base,examples,data->offset,uVar11);
      }
      else {
        fVar15 = merand48(&data->all->random_state);
        uVar13 = 0;
        if (0.36787945 < fVar15) {
          uVar13 = 1;
          if (((((((0.7357589 < fVar15) && (uVar13 = 2, 0.9196986 < fVar15)) &&
                 (uVar13 = 3, 0.98101187 < fVar15)) &&
                ((uVar13 = 4, 0.99634016 < fVar15 && (uVar13 = 5, 0.9994058 < fVar15)))) &&
               (((uVar13 = 6, 0.99991673 < fVar15 &&
                 ((uVar13 = 7, 0.99998975 < fVar15 && (uVar13 = 8, 0.99999887 < fVar15)))) &&
                (uVar13 = 9, 0.9999999 < fVar15)))) &&
              ((((uVar13 = 10, 1.0 < fVar15 && (uVar13 = 0xb, 1.0 < fVar15)) &&
                (uVar13 = 0xc, 1.0 < fVar15)) &&
               (((uVar13 = 0xd, 1.0 < fVar15 && (uVar13 = 0xe, 1.0 < fVar15)) &&
                ((uVar13 = 0xf, 1.0 < fVar15 &&
                 ((uVar13 = 0x10, 1.0 < fVar15 && (uVar13 = 0x11, 1.0 < fVar15)))))))))) &&
             (uVar13 = 0x12, 1.0 < fVar15)) {
            uVar13 = 0x14;
          }
          goto LAB_0020d4b2;
        }
LAB_0020d6b6:
        LEARNER::multiline_learn_or_predict<false>(base,examples,data->offset,uVar11);
      }
      pfVar5 = (local_60->pred).scalars._end;
      for (pfVar7 = (local_60->pred).scalars._begin; pfVar7 != pfVar5; pfVar7 = pfVar7 + 2) {
        pfVar4 = (data->scores).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pfVar4[(uint)*pfVar7] = pfVar7[1] + pfVar4[(uint)*pfVar7];
      }
      if (data->first_only == false) {
        paVar6 = (local_60->pred).a_s._begin;
        lVar9 = (long)(local_60->pred).scalars._end - (long)paVar6;
        if (lVar9 != 0) {
          uVar10 = lVar9 >> 3;
          uVar8 = 1;
          uVar12 = uVar8;
          if (1 < uVar10) {
            do {
              uVar12 = uVar8;
              if ((paVar6[uVar8].score != paVar6->score) ||
                 (NAN(paVar6[uVar8].score) || NAN(paVar6->score))) break;
              uVar8 = uVar8 + 1;
              uVar12 = uVar10;
            } while (uVar10 != uVar8);
          }
          uVar8 = 0;
          do {
            uVar2 = (local_68->a_s)._begin[uVar8].action;
            pfVar4 = (local_48->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                     super__Vector_impl_data._M_start;
            pfVar4[uVar2] = pfVar4[uVar2] + 1.0 / (float)uVar12;
            uVar8 = uVar8 + 1;
          } while (uVar12 != uVar8);
        }
      }
      else {
        uVar2 = ((local_68->a_s)._begin)->action;
        pfVar4 = (local_48->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        pfVar4[uVar2] = pfVar4[uVar2] + 1.0;
      }
      if (1 < uVar13 && local_58 != (example *)0x0) {
        iVar14 = uVar13 - 1;
        do {
          LEARNER::multiline_learn_or_predict<true>(base,examples,data->offset,uVar11);
          iVar14 = iVar14 + -1;
        } while (iVar14 != 0);
      }
      uVar12 = (ulong)(uVar11 + 1);
    } while (uVar12 < data->bag_size);
  }
  v_array<ACTION_SCORE::action_score>::clear(&data->action_probs);
  if ((data->scores).super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (data->scores).super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_start) {
    local_78.action = 0;
    local_78.score = 0.0;
    do {
      uVar11 = local_78.action;
      v_array<ACTION_SCORE::action_score>::push_back(&data->action_probs,&local_78);
      local_78.action = uVar11 + 1;
      local_78.score = 0.0;
    } while ((ulong)local_78 <
             (ulong)((long)(data->scores).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                           super__Vector_impl_data._M_finish -
                     (long)(data->scores).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                           super__Vector_impl_data._M_start >> 2));
  }
  local_70 = (data->action_probs)._begin;
  local_38 = (data->action_probs)._end;
  local_78 = (action_score)
             &std::iterator<std::random_access_iterator_tag,float,long,float*,float>::typeinfo;
  local_40 = &std::iterator<std::random_access_iterator_tag,float,long,float*,float>::typeinfo;
  exploration::
  generate_bag<__gnu_cxx::__normal_iterator<float*,std::vector<float,std::allocator<float>>>,ACTION_SCORE::score_iterator>
            ((data->top_actions).super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start,
             (data->top_actions).super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_finish,&local_78,&local_40);
  local_70 = (data->action_probs)._begin;
  local_38 = (data->action_probs)._end;
  local_78 = (action_score)
             &std::iterator<std::random_access_iterator_tag,float,long,float*,float>::typeinfo;
  local_40 = &std::iterator<std::random_access_iterator_tag,float,long,float*,float>::typeinfo;
  exploration::enforce_minimum_probability<ACTION_SCORE::score_iterator>
            (data->epsilon,1,&local_78,&local_40);
  do_sort(data);
  if (local_50 != 0) {
    uVar12 = 0;
    do {
      (local_68->a_s)._begin[uVar12] = (data->action_probs)._begin[uVar12];
      uVar12 = uVar12 + 1;
    } while (local_50 != uVar12);
  }
  return;
}

Assistant:

void predict_or_learn_bag(cb_explore_adf& data, multi_learner& base, multi_ex& examples)
{
  // Randomize over predictions from a base set of predictors
  v_array<action_score>& preds = examples[0]->pred.a_s;
  uint32_t num_actions = (uint32_t)examples.size();
  if (num_actions == 0)
  {
    preds.clear();
    return;
  }

  data.scores.clear();
  for (uint32_t i = 0; i < num_actions; i++) data.scores.push_back(0.f);
  vector<float>& top_actions = data.top_actions;
  top_actions.assign(num_actions, 0);
  bool test_sequence = test_adf_sequence(examples) == nullptr;
  for (uint32_t i = 0; i < data.bag_size; i++)
  {
    // avoid updates to the random num generator
    // for greedify, always update first policy once
    uint32_t count = is_learn ? ((data.greedify && i == 0) ? 1 : BS::weight_gen(*data.all)) : 0;

    if (is_learn && count > 0 && !test_sequence)
      multiline_learn_or_predict<true>(base, examples, data.offset, i);
    else
      multiline_learn_or_predict<false>(base, examples, data.offset, i);

    assert(preds.size() == num_actions);
    for (auto e : preds) data.scores[e.action] += e.score;

    if (!data.first_only)
    {
      size_t tied_actions = fill_tied(data, preds);
      for (size_t i = 0; i < tied_actions; ++i) top_actions[preds[i].action] += 1.f / tied_actions;
    }
    else
      top_actions[preds[0].action] += 1.f;
    if (is_learn && !test_sequence)
      for (uint32_t j = 1; j < count; j++) multiline_learn_or_predict<true>(base, examples, data.offset, i);
  }

  data.action_probs.clear();
  for (uint32_t i = 0; i < data.scores.size(); i++) data.action_probs.push_back({i, 0.});

  // generate distribution over actions
  generate_bag(
      begin(data.top_actions), end(data.top_actions), begin_scores(data.action_probs), end_scores(data.action_probs));

  enforce_minimum_probability(data.epsilon, true, begin_scores(data.action_probs), end_scores(data.action_probs));

  do_sort(data);

  for (size_t i = 0; i < num_actions; i++) preds[i] = data.action_probs[i];
}